

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

Path * __thiscall Path::parentDir(Path *__return_storage_ptr__,Path *this)

{
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  size_type *psVar10;
  _Alloc_hider local_38;
  ulong local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  sVar1 = (this->super_String).mString._M_string_length;
  if (sVar1 == 1) {
    if (*(this->super_String).mString._M_dataplus._M_p != '/') goto LAB_0014ed3b;
  }
  else if (sVar1 != 0) {
LAB_0014ed3b:
    pcVar2 = (this->super_String).mString._M_dataplus._M_p;
    local_38._M_p = (pointer)&local_28;
    std::__cxx11::string::_M_construct<char*>((string *)&local_38,pcVar2,pcVar2 + sVar1);
    psVar10 = &local_30;
    uVar9 = local_30 & 0xffffffff;
    uVar4 = (int)local_30 - 1;
    uVar7 = 0xffffffff;
    if ((int)uVar4 < -1) {
      uVar7 = uVar4;
    }
    do {
      uVar9 = uVar9 - 1;
      uVar8 = (uint)uVar9;
      uVar4 = uVar7;
      if ((int)uVar8 < 0) break;
      uVar5 = (ulong)(uVar8 & 0x7fffffff);
      if (local_30 <= uVar5) goto LAB_0014ee40;
      uVar4 = uVar8;
    } while (local_38._M_p[uVar5] == '/');
    if (-1 < (int)uVar4) {
      do {
        uVar5 = (ulong)uVar4;
        if (local_30 <= uVar5) {
LAB_0014ee40:
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
        }
        if (local_38._M_p[uVar5] == '/') goto LAB_0014edb4;
        bVar3 = 0 < (int)uVar4;
        uVar4 = uVar4 - 1;
      } while (bVar3);
      uVar4 = 0xffffffff;
    }
LAB_0014edb4:
    if ((int)uVar4 < 0) {
      paVar6 = &(__return_storage_ptr__->super_String).mString.field_2;
      (__return_storage_ptr__->super_String).mString._M_dataplus._M_p = (pointer)paVar6;
      psVar10 = &(__return_storage_ptr__->super_String).mString._M_string_length;
    }
    else {
      if (uVar4 + 1 < local_30) {
        std::__cxx11::string::resize((ulong)&local_38,(char)(uVar4 + 1));
      }
      if ((local_30 == 0) || (local_38._M_p[local_30 - 1] != '/')) {
        __assert_fail("copy.endsWith(\'/\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Path.cpp"
                      ,0x37,"Path Path::parentDir() const");
      }
      paVar6 = &(__return_storage_ptr__->super_String).mString.field_2;
      (__return_storage_ptr__->super_String).mString._M_dataplus._M_p = (pointer)paVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_p == &local_28) {
        paVar6->_M_allocated_capacity = local_28._M_allocated_capacity;
        *(undefined8 *)((long)&(__return_storage_ptr__->super_String).mString.field_2 + 8) =
             local_28._8_8_;
      }
      else {
        (__return_storage_ptr__->super_String).mString._M_dataplus._M_p = local_38._M_p;
        (__return_storage_ptr__->super_String).mString.field_2._M_allocated_capacity =
             local_28._M_allocated_capacity;
      }
      (__return_storage_ptr__->super_String).mString._M_string_length = local_30;
      paVar6 = &local_28;
      local_38._M_p = (pointer)&local_28;
    }
    *psVar10 = 0;
    paVar6->_M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_p == &local_28) {
      return __return_storage_ptr__;
    }
    operator_delete(local_38._M_p);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->super_String).mString._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_String).mString.field_2;
  (__return_storage_ptr__->super_String).mString._M_string_length = 0;
  (__return_storage_ptr__->super_String).mString.field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Path Path::parentDir() const
{
    if (isEmpty())
        return Path();
    if (size() == 1 && at(0) == '/')
        return Path();
    Path copy = *this;
    int i = copy.size() - 1;
    while (i >= 0 && copy.at(i) == '/')
        --i;
    while (i >= 0 && copy.at(i) != '/')
        --i;
    if (i < 0)
        return Path();
    copy.truncate(i + 1);
    assert(copy.endsWith('/'));
    return copy;
}